

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O0

void asmjit::_SetBits(size_t *buf,size_t index,size_t len)

{
  size_t c;
  size_t j;
  size_t i;
  size_t len_local;
  size_t index_local;
  size_t *buf_local;
  
  if (len != 0) {
    c = 0x40 - (index & 0x3f);
    if (len < c) {
      c = len;
    }
    buf_local = buf + (index >> 6);
    *buf_local = (0xffffffffffffffffU >> (0x40U - (char)c & 0x3f)) << (sbyte)(index & 0x3f) |
                 *buf_local;
    for (len_local = len - c; buf_local = buf_local + 1, 0x3f < len_local;
        len_local = len_local - 0x40) {
      *buf_local = 0xffffffffffffffff;
    }
    if (len_local != 0) {
      *buf_local = 0xffffffffffffffffU >> (0x40U - (char)len_local & 0x3f) | *buf_local;
    }
  }
  return;
}

Assistant:

static void _SetBits(size_t* buf, size_t index, size_t len) noexcept {
  if (len == 0)
    return;

  size_t i = index / kBitsPerEntity; // size_t[]
  size_t j = index % kBitsPerEntity; // size_t[][] bit index

  // How many bytes process in the first group.
  size_t c = kBitsPerEntity - j;
  if (c > len)
    c = len;

  // Offset.
  buf += i;

  *buf++ |= ((~(size_t)0) >> (kBitsPerEntity - c)) << j;
  len -= c;

  while (len >= kBitsPerEntity) {
    *buf++ = ~(size_t)0;
    len -= kBitsPerEntity;
  }

  if (len)
    *buf |= ((~(size_t)0) >> (kBitsPerEntity - len));
}